

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> * __thiscall
cmGlobalGenerator::CreateQtAutoGeneratorsTargets
          (vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           *__return_storage_ptr__,cmGlobalGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  cmLocalGenerator *lg;
  undefined8 this_00;
  bool bVar2;
  TargetType TVar3;
  ulong uVar4;
  size_type sVar5;
  reference ppcVar6;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  cmMakefile *this_01;
  char *pcVar7;
  reference ppcVar8;
  bool local_202;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_178;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_170;
  iterator ti_1;
  cmGeneratorTarget *gt;
  string local_158;
  allocator local_132;
  allocator local_131;
  string local_130;
  undefined1 local_110 [8];
  string qtMajorVersion;
  cmMakefile *mf;
  string local_e0;
  byte local_bb;
  byte local_ba;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_70;
  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_68;
  iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> filteredTargets;
  undefined1 local_38 [8];
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  uint i;
  cmGlobalGenerator *this_local;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *autogenTargets;
  
  targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::vector
            (__return_storage_ptr__);
  targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  do {
    uVar4 = (ulong)(uint)targets.
                         super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    sVar5 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::size
                      (&this->LocalGenerators);
    if (sVar5 <= uVar4) {
      return __return_storage_ptr__;
    }
    ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                        (&this->LocalGenerators,
                         (ulong)(uint)targets.
                                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __x = cmLocalGenerator::GetGeneratorTargets(*ppcVar6);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_38,__x);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    sVar5 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::size
                      ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_38
                      );
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::reserve
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,sVar5);
    local_68._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_38);
    while( true ) {
      local_70._M_current =
           (cmGeneratorTarget **)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_38)
      ;
      bVar2 = __gnu_cxx::operator!=(&local_68,&local_70);
      if (!bVar2) break;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_68);
      TVar3 = cmGeneratorTarget::GetType(*ppcVar8);
      if (TVar3 != GLOBAL_TARGET) {
        ppcVar8 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_68);
        TVar3 = cmGeneratorTarget::GetType(*ppcVar8);
        if (TVar3 != EXECUTABLE) {
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_68);
          TVar3 = cmGeneratorTarget::GetType(*ppcVar8);
          if (TVar3 != STATIC_LIBRARY) {
            ppcVar8 = __gnu_cxx::
                      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                      ::operator*(&local_68);
            TVar3 = cmGeneratorTarget::GetType(*ppcVar8);
            if (TVar3 != SHARED_LIBRARY) {
              ppcVar8 = __gnu_cxx::
                        __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                        ::operator*(&local_68);
              TVar3 = cmGeneratorTarget::GetType(*ppcVar8);
              if (TVar3 != MODULE_LIBRARY) {
                ppcVar8 = __gnu_cxx::
                          __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          ::operator*(&local_68);
                TVar3 = cmGeneratorTarget::GetType(*ppcVar8);
                if (TVar3 != OBJECT_LIBRARY) goto LAB_00742f4c;
              }
            }
          }
        }
        ppcVar8 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_68);
        pcVar1 = *ppcVar8;
        std::allocator<char>::allocator();
        local_ba = 0;
        local_bb = 0;
        mf._6_1_ = 0;
        mf._5_1_ = 0;
        std::__cxx11::string::string((string *)&local_90,"AUTOMOC",&local_91);
        bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_90);
        if (bVar2) {
LAB_00742ae0:
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_68);
          local_202 = cmGeneratorTarget::IsImported(*ppcVar8);
        }
        else {
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_68);
          pcVar1 = *ppcVar8;
          std::allocator<char>::allocator();
          local_ba = 1;
          std::__cxx11::string::string((string *)&local_b8,"AUTOUIC",&local_b9);
          local_bb = 1;
          bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_b8);
          if (bVar2) goto LAB_00742ae0;
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_68);
          pcVar1 = *ppcVar8;
          std::allocator<char>::allocator();
          mf._6_1_ = 1;
          std::__cxx11::string::string((string *)&local_e0,"AUTORCC",(allocator *)((long)&mf + 7));
          mf._5_1_ = 1;
          bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_e0);
          local_202 = true;
          if (bVar2) goto LAB_00742ae0;
        }
        if ((mf._5_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_e0);
        }
        if ((mf._6_1_ & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
        }
        if ((local_bb & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_b8);
        }
        if ((local_ba & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        }
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator((allocator<char> *)&local_91);
        if (local_202 == false) {
          ppcVar8 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_68);
          this_01 = cmTarget::GetMakefile((*ppcVar8)->Target);
          qtMajorVersion.field_2._8_8_ = this_01;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_130,"QT_VERSION_MAJOR",&local_131);
          pcVar7 = cmMakefile::GetSafeDefinition(this_01,&local_130);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_110,pcVar7,&local_132);
          std::allocator<char>::~allocator((allocator<char> *)&local_132);
          std::__cxx11::string::~string((string *)&local_130);
          std::allocator<char>::~allocator((allocator<char> *)&local_131);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_110,"");
          this_00 = qtMajorVersion.field_2._8_8_;
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_158,"Qt5Core_VERSION_MAJOR",(allocator *)((long)&gt + 7));
            pcVar7 = cmMakefile::GetSafeDefinition((cmMakefile *)this_00,&local_158);
            std::__cxx11::string::operator=((string *)local_110,pcVar7);
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator((allocator<char> *)((long)&gt + 7));
          }
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_110,"4");
          if ((bVar2) &&
             (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_110,"5"), bVar2)) {
            gt._0_4_ = 7;
          }
          else {
            ppcVar8 = __gnu_cxx::
                      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                      ::operator*(&local_68);
            ti_1._M_current = (cmGeneratorTarget **)*ppcVar8;
            cmQtAutoGeneratorInitializer::InitializeAutogenSources
                      ((cmGeneratorTarget *)ti_1._M_current);
            std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::push_back
                      ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,
                       (value_type *)&ti_1);
            gt._0_4_ = 0;
          }
          std::__cxx11::string::~string((string *)local_110);
        }
      }
LAB_00742f4c:
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_68);
    }
    local_170._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    while( true ) {
      local_178._M_current =
           (cmGeneratorTarget **)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
      bVar2 = __gnu_cxx::operator!=(&local_170,&local_178);
      if (!bVar2) break;
      ppcVar6 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                          (&this->LocalGenerators,
                           (ulong)(uint)targets.
                                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      lg = *ppcVar6;
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_170);
      cmQtAutoGeneratorInitializer::InitializeAutogenTarget(lg,*ppcVar8);
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_170);
      std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::push_back
                (__return_storage_ptr__,ppcVar8);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_**,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_170);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)local_38);
    targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         (uint)targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
  } while( true );
}

Assistant:

std::vector<const cmGeneratorTarget*>
cmGlobalGenerator::CreateQtAutoGeneratorsTargets()
{
  std::vector<const cmGeneratorTarget*> autogenTargets;

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    std::vector<cmGeneratorTarget*> targets =
      this->LocalGenerators[i]->GetGeneratorTargets();
    std::vector<cmGeneratorTarget*> filteredTargets;
    filteredTargets.reserve(targets.size());
    for (std::vector<cmGeneratorTarget*>::iterator ti = targets.begin();
         ti != targets.end(); ++ti) {
      if ((*ti)->GetType() == cmStateEnums::GLOBAL_TARGET) {
        continue;
      }
      if ((*ti)->GetType() != cmStateEnums::EXECUTABLE &&
          (*ti)->GetType() != cmStateEnums::STATIC_LIBRARY &&
          (*ti)->GetType() != cmStateEnums::SHARED_LIBRARY &&
          (*ti)->GetType() != cmStateEnums::MODULE_LIBRARY &&
          (*ti)->GetType() != cmStateEnums::OBJECT_LIBRARY) {
        continue;
      }
      if ((!(*ti)->GetPropertyAsBool("AUTOMOC") &&
           !(*ti)->GetPropertyAsBool("AUTOUIC") &&
           !(*ti)->GetPropertyAsBool("AUTORCC")) ||
          (*ti)->IsImported()) {
        continue;
      }
      // don't do anything if there is no Qt4 or Qt5Core (which contains moc):
      cmMakefile* mf = (*ti)->Target->GetMakefile();
      std::string qtMajorVersion = mf->GetSafeDefinition("QT_VERSION_MAJOR");
      if (qtMajorVersion == "") {
        qtMajorVersion = mf->GetSafeDefinition("Qt5Core_VERSION_MAJOR");
      }
      if (qtMajorVersion != "4" && qtMajorVersion != "5") {
        continue;
      }

      cmGeneratorTarget* gt = *ti;

      cmQtAutoGeneratorInitializer::InitializeAutogenSources(gt);
      filteredTargets.push_back(gt);
    }
    for (std::vector<cmGeneratorTarget*>::iterator ti =
           filteredTargets.begin();
         ti != filteredTargets.end(); ++ti) {
      cmQtAutoGeneratorInitializer::InitializeAutogenTarget(
        this->LocalGenerators[i], *ti);
      autogenTargets.push_back(*ti);
    }
  }
#endif
  return autogenTargets;
}